

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

parasail_matrix_t * parasail_matrix_copy(parasail_matrix_t *matrix)

{
  size_t sVar1;
  int *__dest;
  int *__dest_00;
  char *__dest_01;
  size_t _size_4;
  size_t query_size;
  size_t _size_3;
  size_t _size_2;
  size_t _size_1;
  char *new_query;
  char *new_alphabet;
  int *new_matrix;
  int *new_mapper;
  size_t alphabet_size;
  size_t matrix_size;
  size_t _size;
  parasail_matrix_t *retval;
  parasail_matrix_t *matrix_local;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_matrix_copy","matrix");
    matrix_local = (parasail_matrix_t *)0x0;
  }
  else {
    matrix_local = (parasail_matrix_t *)malloc(0x48);
    if (matrix_local == (parasail_matrix_t *)0x0) {
      fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_copy",0x48);
      matrix_local = (parasail_matrix_t *)0x0;
    }
    else {
      matrix_local->name = matrix->name;
      matrix_local->size = matrix->size;
      matrix_local->max = matrix->max;
      matrix_local->min = matrix->min;
      matrix_local->type = matrix->type;
      matrix_local->length = matrix->length;
      alphabet_size = 0;
      sVar1 = (size_t)(matrix->size + 1);
      _size_1 = 0;
      if (matrix->type == 0) {
        alphabet_size = (size_t)(matrix->size * matrix->size);
      }
      else if (matrix->type == 1) {
        alphabet_size = (size_t)(matrix->size * matrix->length);
      }
      __dest = (int *)malloc(0x400);
      if (__dest == (int *)0x0) {
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_copy",0x400);
        matrix_local = (parasail_matrix_t *)0x0;
      }
      else {
        memcpy(__dest,matrix->mapper,0x400);
        __dest_00 = (int *)malloc(alphabet_size << 2);
        if (__dest_00 == (int *)0x0) {
          fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_copy",
                  alphabet_size << 2);
          matrix_local = (parasail_matrix_t *)0x0;
        }
        else {
          memcpy(__dest_00,matrix->matrix,alphabet_size << 2);
          __dest_01 = (char *)malloc(sVar1);
          if (__dest_01 == (char *)0x0) {
            fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_copy",sVar1);
            matrix_local = (parasail_matrix_t *)0x0;
          }
          else {
            memcpy(__dest_01,matrix->alphabet,sVar1);
            if (matrix->query != (char *)0x0) {
              sVar1 = strlen(matrix->query);
              _size_1 = (size_t)malloc(sVar1 + 1);
              if ((void *)_size_1 == (void *)0x0) {
                fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_copy",sVar1 + 1)
                ;
                return (parasail_matrix_t *)0x0;
              }
              memcpy((void *)_size_1,matrix->query,sVar1 + 1);
              *(undefined1 *)(_size_1 + sVar1) = 0;
            }
            matrix_local->mapper = __dest;
            matrix_local->matrix = __dest_00;
            matrix_local->user_matrix = __dest_00;
            matrix_local->alphabet = __dest_01;
            matrix_local->query = (char *)_size_1;
          }
        }
      }
    }
  }
  return matrix_local;
}

Assistant:

parasail_matrix_t* parasail_matrix_copy(const parasail_matrix_t *matrix)
{
    parasail_matrix_t *retval = NULL;

    PARASAIL_CHECK_NULL(matrix);

    PARASAIL_NEW(retval, parasail_matrix_t);
    retval->name = matrix->name;
    retval->size = matrix->size;
    retval->max = matrix->max;
    retval->min = matrix->min;
    retval->type = matrix->type;
    retval->length = matrix->length;

    {
        size_t matrix_size = 0;
        size_t alphabet_size = (matrix->size+1);
        int *new_mapper = NULL;
        int *new_matrix = NULL;
        char *new_alphabet = NULL;
        char *new_query = NULL;

        if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
            matrix_size = matrix->size*matrix->size;
        }
        else if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
            matrix_size = matrix->size*matrix->length;
        }

        PARASAIL_CALLOC(new_mapper, int, 256);
        (void)memcpy(new_mapper, matrix->mapper, sizeof(int)*256);

        PARASAIL_CALLOC(new_matrix, int, matrix_size);
        (void)memcpy(new_matrix, matrix->matrix, sizeof(int)*matrix_size);

        PARASAIL_CALLOC(new_alphabet, char, alphabet_size);
        (void)memcpy(new_alphabet, matrix->alphabet, sizeof(char)*alphabet_size);

        if (matrix->query) {
            size_t query_size = strlen(matrix->query);
            PARASAIL_CALLOC(new_query, char, query_size+1);
            (void)memcpy(new_query, matrix->query, sizeof(char)*(query_size+1));
            new_query[query_size] = '\0';
        }

        retval->mapper = new_mapper;
        retval->matrix = new_matrix;
        retval->user_matrix = new_matrix;
        retval->alphabet = new_alphabet;
        retval->query = new_query;
    }

    return retval;
}